

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O3

time_t __thiscall duckdb::CachingFileHandle::GetLastModifiedTime(CachingFileHandle *this)

{
  element_type *in_RAX;
  time_t tVar1;
  pointer *__ptr;
  element_type *local_18;
  
  if (((this->file_handle).
       super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl == (FileHandle *)0x0) &&
     (this->validate != true)) {
    local_18 = in_RAX;
    shared_ptr<duckdb::StorageLockInternals,_true>::operator->(&(this->cached_file->lock).internals)
    ;
    StorageLockInternals::GetSharedLock((StorageLockInternals *)&stack0xffffffffffffffe8);
    tVar1 = this->cached_file->last_modified;
    if (local_18 != (element_type *)0x0) {
      StorageLockKey::~StorageLockKey((StorageLockKey *)local_18);
      operator_delete(local_18);
    }
  }
  else {
    GetFileHandle(this);
    tVar1 = this->last_modified;
  }
  return tVar1;
}

Assistant:

time_t CachingFileHandle::GetLastModifiedTime() {
	if (file_handle || validate) {
		GetFileHandle();
		return last_modified;
	}
	auto guard = cached_file.lock.GetSharedLock();
	return cached_file.LastModified(guard);
}